

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O0

void SharpYuvFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint16_t uVar5;
  int max;
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  short *in_RDI;
  long in_R8;
  byte in_R9B;
  int v1;
  int v0;
  int max_y;
  int i;
  int local_30;
  short *local_10;
  short *local_8;
  
  max = (1 << (in_R9B & 0x1f)) + -1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    sVar1 = local_8[1];
    sVar2 = *local_8;
    sVar3 = local_10[1];
    sVar4 = *local_10;
    uVar5 = clip((uint)*(ushort *)(in_RCX + (long)(local_30 << 1) * 2) +
                 (*local_8 * 9 + local_8[1] * 3 + *local_10 * 3 + (int)local_10[1] + 8 >> 4),max);
    *(uint16_t *)(in_R8 + (long)(local_30 << 1) * 2) = uVar5;
    uVar5 = clip((uint)*(ushort *)(in_RCX + (long)(local_30 * 2 + 1) * 2) +
                 (sVar1 * 9 + sVar2 * 3 + sVar3 * 3 + (int)sVar4 + 8 >> 4),max);
    *(uint16_t *)(in_R8 + (long)(local_30 * 2 + 1) * 2) = uVar5;
    local_8 = local_8 + 1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out,
                                int bit_depth) {
  int i;
  const int max_y = (1 << bit_depth) - 1;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip(best_y[2 * i + 0] + v0, max_y);
    out[2 * i + 1] = clip(best_y[2 * i + 1] + v1, max_y);
  }
}